

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BenchmarkClass.hpp
# Opt level: O0

void __thiscall
benchmarks::BenchmarksClass::AddBenchmark<long,void(*)(benchmarks::BenchmarkContext&,long)>
          (BenchmarksClass *this,string *name,_func_void_BenchmarkContext_ptr_long *benchmarkFunc,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *orderedParamNames)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *orderedParamNames_local;
  _func_void_BenchmarkContext_ptr_long *benchmarkFunc_local;
  string *name_local;
  BenchmarksClass *this_local;
  
  local_28 = orderedParamNames;
  orderedParamNames_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)benchmarkFunc;
  benchmarkFunc_local = (_func_void_BenchmarkContext_ptr_long *)name;
  name_local = &this->_name;
  std::
  make_shared<benchmarks::Benchmark<long>,std::__cxx11::string,void(*)(benchmarks::BenchmarkContext&,long),std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_48,(_func_void_BenchmarkContext_ptr_long **)name,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&orderedParamNames_local);
  std::shared_ptr<benchmarks::IBenchmark>::shared_ptr<benchmarks::Benchmark<long>,void>
            ((shared_ptr<benchmarks::IBenchmark> *)&local_48.field_2,
             (shared_ptr<benchmarks::Benchmark<long>_> *)&local_48);
  std::
  vector<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
  ::push_back(&this->_benchmarks,(value_type *)&local_48.field_2);
  std::shared_ptr<benchmarks::IBenchmark>::~shared_ptr
            ((shared_ptr<benchmarks::IBenchmark> *)&local_48.field_2);
  std::shared_ptr<benchmarks::Benchmark<long>_>::~shared_ptr
            ((shared_ptr<benchmarks::Benchmark<long>_> *)&local_48);
  return;
}

Assistant:

void AddBenchmark(std::string name, Functor_ benchmarkFunc, std::vector<std::string> orderedParamNames = {})
		{ _benchmarks.push_back(std::make_shared<Benchmark<BenchmarkParams_...>>(std::move(name), std::move(benchmarkFunc), std::move(orderedParamNames))); }